

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_connection.cpp
# Opt level: O1

bool __thiscall myutils::IpcConnection::do_connect(IpcConnection *this)

{
  size_type *psVar1;
  string *psVar2;
  undefined4 *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ConnectionSlotInfo *pCVar5;
  ConnectionSlot *pCVar6;
  int *piVar7;
  char *pcVar8;
  Connection_Callback *pCVar9;
  bool bVar10;
  IpcConnection *this_00;
  bool bVar11;
  SOCKET sock;
  int iVar12;
  int iVar13;
  long lVar14;
  rep rVar15;
  undefined8 *puVar16;
  FileMapping *pFVar17;
  ssize_t sVar18;
  size_t sVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  thread *this_01;
  ulong uVar20;
  undefined8 uVar21;
  IpcConnection *pIVar22;
  string addr;
  uint64_t slot_pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ss;
  string local_b8;
  string local_98;
  IpcConnection **local_78;
  long local_70;
  IpcConnection *local_68 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  IpcConnection *local_38;
  
  iVar13 = (int)&local_b8;
  if (this->m_connected != false) {
    return true;
  }
  if ((this->m_addr)._M_string_length == 0) {
    return false;
  }
  lVar14 = std::chrono::_V2::system_clock::now();
  if (lVar14 - (this->m_last_connect_time).__d.__r < 200000000) {
    return false;
  }
  rVar15 = std::chrono::_V2::system_clock::now();
  (this->m_last_connect_time).__d.__r = rVar15;
  clear_data(this);
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"?","");
  psVar2 = &this->m_addr;
  uVar20 = 0;
  local_38 = this;
  lVar14 = std::__cxx11::string::find_first_of((char *)psVar2,(ulong)local_b8._M_dataplus._M_p,0);
  if (lVar14 != -1) {
    do {
      std::__cxx11::string::substr((ulong)&local_98,(ulong)psVar2);
      trim(&local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_58,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      uVar20 = lVar14 + 1;
      lVar14 = std::__cxx11::string::find_first_of
                         ((char *)psVar2,(ulong)local_b8._M_dataplus._M_p,uVar20);
    } while (lVar14 != -1);
  }
  if (uVar20 != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)&local_98,(ulong)psVar2);
    trim(&local_98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_58,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  paVar4 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar4) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"shm_tq_ipc_","");
  std::__cxx11::string::substr
            ((ulong)&local_78,
             (ulong)local_58.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this_00 = local_38;
  uVar21 = (IpcConnection *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar4) {
    uVar21 = local_b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < (IpcConnection *)(local_70 + local_b8._M_string_length)) {
    pIVar22 = (IpcConnection *)0xf;
    if (local_78 != local_68) {
      pIVar22 = local_68[0];
    }
    if ((IpcConnection *)(local_70 + local_b8._M_string_length) <= pIVar22) {
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_78,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
      goto LAB_0014ac98;
    }
  }
  puVar16 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_78);
LAB_0014ac98:
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  psVar1 = puVar16 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_98.field_2._M_allocated_capacity = *psVar1;
    local_98.field_2._8_8_ = puVar16[3];
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar1;
    local_98._M_dataplus._M_p = (pointer)*puVar16;
  }
  local_98._M_string_length = puVar16[1];
  *puVar16 = psVar1;
  puVar16[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar4) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  pFVar17 = (FileMapping *)operator_new(0x30);
  pFVar17->m_pMapAddress = (char *)0x0;
  pFVar17->m_filesize = 0;
  pFVar17->m_fd = -1;
  (pFVar17->m_id)._M_dataplus._M_p = (pointer)&(pFVar17->m_id).field_2;
  (pFVar17->m_id)._M_string_length = 0;
  (pFVar17->m_id).field_2._M_local_buf[0] = '\0';
  this_00->m_svr_shmem = pFVar17;
  bVar11 = FileMapping::open_shmem(pFVar17,&local_98,0x9c50,false);
  bVar10 = true;
  if ((bVar11) &&
     (pCVar5 = (ConnectionSlotInfo *)this_00->m_svr_shmem->m_pMapAddress,
     this_00->m_slot_info = pCVar5, pCVar5->slot_size == 400)) {
    if (this_00->m_socket != -1) {
      ::close(this_00->m_socket);
    }
    sock = connect_socket("127.0.0.1",this_00->m_slot_info->svr_port);
    this_00->m_socket = sock;
    if ((sock != -1) && (bVar11 = check_connect(sock,2), bVar11)) {
      set_socket_nonblock(this_00->m_socket,false);
      lVar14 = random();
      this_00->m_my_id = (long)(int)lVar14;
      sVar18 = ::send(this_00->m_socket,&this_00->m_my_id,8,0);
      if ((int)sVar18 == 8) {
        local_78 = (IpcConnection **)0x0;
        sVar18 = recv(this_00->m_socket,&local_78,8,0);
        bVar10 = true;
        if ((((int)sVar18 == 8) &&
            (pCVar5 = this_00->m_slot_info, local_78 < (IpcConnection **)(ulong)pCVar5->slot_count))
           && (pCVar5->slots[(long)local_78].client_id.super___atomic_base<unsigned_long>._M_i ==
               this_00->m_my_id)) {
          this_00->m_slot = (ConnectionSlot *)&pCVar5->slots[(long)local_78].client_id;
          set_socket_nonblock(this_00->m_socket,true);
          pFVar17 = (FileMapping *)operator_new(0x30);
          pFVar17->m_pMapAddress = (char *)0x0;
          pFVar17->m_filesize = 0;
          pFVar17->m_fd = -1;
          (pFVar17->m_id)._M_dataplus._M_p = (pointer)&(pFVar17->m_id).field_2;
          (pFVar17->m_id)._M_string_length = 0;
          (pFVar17->m_id).field_2._M_local_buf[0] = '\0';
          this_00->m_my_shmem = pFVar17;
          pCVar6 = this_00->m_slot;
          pcVar8 = pCVar6->shmem_name;
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          sVar19 = strlen(pcVar8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,pcVar8,pCVar6->shmem_name + sVar19);
          bVar11 = FileMapping::open_shmem(pFVar17,&local_b8,this_00->m_slot->shmem_size,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          if (bVar11) {
            iVar12 = SharedSemaphore::open(this_00->m_slot->sem_send,iVar13);
            this_00->m_sem_recv = (SharedSemaphore *)CONCAT44(extraout_var,iVar12);
            iVar13 = SharedSemaphore::open(this_00->m_slot->sem_recv,iVar13);
            this_00->m_sem_send = (SharedSemaphore *)CONCAT44(extraout_var_00,iVar13);
            if (((SharedSemaphore *)CONCAT44(extraout_var_00,iVar13) != (SharedSemaphore *)0x0) &&
               (this_00->m_sem_recv != (SharedSemaphore *)0x0)) {
              piVar7 = (int *)this_00->m_my_shmem->m_pMapAddress;
              iVar13 = piVar7[3];
              this_00->m_send_queue = (ShmemQueue *)((long)piVar7 + (long)iVar13);
              iVar12 = piVar7[2];
              puVar3 = (undefined4 *)((long)piVar7 + (long)iVar13);
              LOCK();
              *puVar3 = 0;
              UNLOCK();
              puVar3[1] = iVar12 + -0x14;
              puVar3[2] = puVar3[1];
              puVar3[4] = 0;
              puVar3[3] = puVar3[4];
              memset(puVar3 + 5,0,(long)(iVar12 + -0x14));
              pcVar8 = this_00->m_my_shmem->m_pMapAddress;
              iVar13 = piVar7[1];
              this_00->m_recv_queue = (ShmemQueue *)(pcVar8 + iVar13);
              iVar12 = *piVar7;
              pcVar8 = pcVar8 + iVar13;
              LOCK();
              pcVar8[0] = '\0';
              pcVar8[1] = '\0';
              pcVar8[2] = '\0';
              pcVar8[3] = '\0';
              UNLOCK();
              *(int *)(pcVar8 + 4) = iVar12 + -0x14;
              *(undefined4 *)(pcVar8 + 8) = *(undefined4 *)(pcVar8 + 4);
              pcVar8[0x10] = '\0';
              pcVar8[0x11] = '\0';
              pcVar8[0x12] = '\0';
              pcVar8[0x13] = '\0';
              *(undefined4 *)(pcVar8 + 0xc) = *(undefined4 *)(pcVar8 + 0x10);
              memset(pcVar8 + 0x14,0,(long)(iVar12 + -0x14));
              set_conn_stat(this_00,true);
              this_00->m_should_exit = false;
              this_01 = (thread *)operator_new(8);
              local_b8._M_dataplus._M_p = (pointer)recv_run;
              local_b8._M_string_length = 0;
              local_b8.field_2._M_allocated_capacity = (size_type)this_00;
              std::thread::
              thread<std::_Bind<void(myutils::IpcConnection::*(myutils::IpcConnection*))()>,,void>
                        (this_01,(_Bind<void_(myutils::IpcConnection::*(myutils::IpcConnection_*))()>
                                  *)&local_b8);
              this_00->m_recv_thread = this_01;
              pCVar9 = this_00->m_callback;
              if (pCVar9 != (Connection_Callback *)0x0) {
                (*pCVar9->_vptr_Connection_Callback[2])(pCVar9,1);
              }
              bVar10 = false;
            }
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  if (bVar10) {
    clear_data(this_00);
    return false;
  }
  return true;
}

Assistant:

bool IpcConnection::do_connect() 
{
    if (m_connected) return true;

    if (m_addr.empty()) return false;

    if (system_clock::now() - m_last_connect_time < milliseconds(200))
        return false;

    m_last_connect_time = system_clock::now();

    clear_data();

    do {
        vector<string> ss;
        split(m_addr, "?", &ss);
        string addr = string("shm_tq_ipc_") + ss[0].substr(6);
        m_svr_shmem = new myutils::FileMapping();
        if (!m_svr_shmem) break;
        if (!m_svr_shmem->open_shmem(addr, sizeof(ConnectionSlotInfo), false))
            break;

        m_slot_info = (ConnectionSlotInfo*)m_svr_shmem->addr();
        if (m_slot_info->slot_size != sizeof(ConnectionSlot)) break;

        if (m_socket != INVALID_SOCKET)
            closesocket(m_socket);

        m_socket = connect_socket("127.0.0.1", m_slot_info->svr_port);
        if (m_socket == INVALID_SOCKET || !myutils::check_connect(m_socket, 2))
            break;

        set_socket_nonblock(m_socket, false);
        m_my_id = (uint64_t)myutils::random();
        int r = ::send(m_socket, (const char*)&m_my_id, sizeof(m_my_id), 0);
        if (r != sizeof(m_my_id))
            break;

        uint64_t slot_pos = 0;
        r = ::recv(m_socket, (char*)&slot_pos, sizeof(slot_pos), 0);
        if (r != sizeof(slot_pos))
            break;
	
        if (slot_pos >= m_slot_info->slot_count) break;

        auto slot = m_slot_info->slots + slot_pos;
        if (slot->client_id != m_my_id) break;

        m_slot = slot;
        set_socket_nonblock(m_socket, true);

        m_my_shmem = new myutils::FileMapping();
        if (!m_my_shmem->open_shmem(m_slot->shmem_name, m_slot->shmem_size, false))
            break;

        m_sem_recv = SharedSemaphore::open(m_slot->sem_send);
        m_sem_send = SharedSemaphore::open(m_slot->sem_recv);
        if (!m_sem_recv || !m_sem_send) break;

        ShmemHead* head = (ShmemHead*)m_my_shmem->addr();

        // different between client and server
        m_send_queue = (ShmemQueue*)(m_my_shmem->addr() + head->recv_offset);
        m_send_queue->init(head->recv_size);
        m_recv_queue = (ShmemQueue*)(m_my_shmem->addr() + head->send_offset);
        m_recv_queue->init(head->send_size);

        set_conn_stat(true);
        m_should_exit = false;
        m_recv_thread = new thread(bind(&IpcConnection::recv_run, this));

        if (m_callback)
            m_callback->on_conn_status(true);

        return true;

    } while (false);

    clear_data();

    return false;
}